

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

scalar __thiscall
absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>(absl *this,S2Polygon **args)

{
  S2PolygonLayer *this_00;
  Options local_20;
  
  this_00 = (S2PolygonLayer *)operator_new(0x28);
  local_20.edge_type_ = DIRECTED;
  local_20.validate_ = false;
  s2builderutil::S2PolygonLayer::S2PolygonLayer(this_00,*args,&local_20);
  *(S2PolygonLayer **)this = this_00;
  return (__uniq_ptr_data<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>,_true,_true>
          )(__uniq_ptr_data<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}